

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tlsio_openssl.c
# Opt level: O1

int tlsio_openssl_init(void)

{
  LOGGER_LOG p_Var1;
  LOCK_HANDLE pvVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  LOG_CATEGORY LVar6;
  char *pcVar7;
  
  OPENSSL_init_ssl(0,0);
  OPENSSL_init_ssl(0x200002,0);
  ERR_load_BIO_strings();
  OPENSSL_init_crypto(0xc,0);
  if (openssl_locks == (LOCK_HANDLE *)0x0) {
    openssl_locks = (LOCK_HANDLE *)malloc(8);
    if (openssl_locks == (LOCK_HANDLE *)0x0) {
      p_Var1 = xlogging_get_log_function();
      iVar5 = 0x25f;
      if (p_Var1 == (LOGGER_LOG)0x0) goto LAB_0016a9aa;
      pcVar7 = "Failed to allocate locks, size:%zu";
      LVar6 = AZ_LOG_ERROR;
      iVar4 = 0x267;
      iVar5 = 0x25f;
    }
    else {
      bVar3 = true;
      iVar4 = 0x27e;
      do {
        iVar5 = iVar4;
        if (!bVar3) goto LAB_0016a9aa;
        pvVar2 = Lock_Init();
        *openssl_locks = pvVar2;
        bVar3 = false;
        iVar4 = 0;
      } while (pvVar2 != (LOCK_HANDLE)0x0);
      p_Var1 = xlogging_get_log_function();
      if (p_Var1 == (LOGGER_LOG)0x0) goto LAB_0016a9aa;
      pcVar7 = "Failed to allocate lock %d";
      LVar6 = AZ_LOG_ERROR;
      iVar4 = 0x272;
    }
  }
  else {
    p_Var1 = xlogging_get_log_function();
    iVar5 = 0x25f;
    if (p_Var1 == (LOGGER_LOG)0x0) goto LAB_0016a9aa;
    pcVar7 = "Locks already initialized";
    LVar6 = AZ_LOG_INFO;
    iVar4 = 0x25e;
    iVar5 = 0x25f;
  }
  (*p_Var1)(LVar6,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/c-utility/adapters/tlsio_openssl.c"
            ,"openssl_static_locks_install",iVar4,1,pcVar7);
LAB_0016a9aa:
  if (iVar5 == 0) {
    iVar5 = 0;
  }
  else {
    p_Var1 = xlogging_get_log_function();
    iVar5 = 0x4de;
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_INFO,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/c-utility/adapters/tlsio_openssl.c"
                ,"tlsio_openssl_init",0x4dd,1,"Failed to install static locks in OpenSSL!");
    }
  }
  return iVar5;
}

Assistant:

int tlsio_openssl_init(void)
{
    (void)SSL_library_init();

    SSL_load_error_strings();
    ERR_load_BIO_strings();
    OpenSSL_add_all_algorithms();

    if (openssl_static_locks_install() != 0)
    {
        LogInfo("Failed to install static locks in OpenSSL!");
        return MU_FAILURE;
    }

    openssl_dynamic_locks_install();
    return 0;
}